

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

void ncnn::copy_cut_border_image<unsigned_short>(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  void *__dest;
  void *__src;
  
  iVar1 = dst->h;
  if (0 < iVar1) {
    uVar2 = dst->w;
    iVar3 = src->w;
    __dest = dst->data;
    __src = (void *)((long)src->data + (long)left * 2 + (long)(top * iVar3) * src->elemsize);
    iVar5 = 0;
    do {
      if ((int)uVar2 < 0xc) {
        if (0 < (int)uVar2) {
          uVar4 = 0;
          do {
            *(undefined2 *)((long)__dest + uVar4 * 2) = *(undefined2 *)((long)__src + uVar4 * 2);
            uVar4 = uVar4 + 1;
          } while (uVar2 != uVar4);
        }
      }
      else {
        memcpy(__dest,__src,(ulong)uVar2 * 2);
        iVar3 = src->w;
      }
      __dest = (void *)((long)__dest + (long)(int)uVar2 * 2);
      __src = (void *)((long)__src + (long)iVar3 * 2);
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar1);
  }
  return;
}

Assistant:

static void copy_cut_border_image(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src.row<T>(top) + left;
    T* outptr = dst;//.data;

    for (int y = 0; y < h; y++)
    {
        if(w < 12)
        {
            for (int x = 0; x < w; x++)
            {
                outptr[x] = ptr[x];
            }
        }
        else
        {
            memcpy(outptr, ptr, w*sizeof(T));
        }
        outptr += w;
        ptr += src.w;
    }
}